

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForcePlatforms.cpp
# Opt level: O2

void __thiscall
ezc3d::Modules::ForcePlatform::extractCalMatrix(ForcePlatform *this,size_t idx,c3d *c3d)

{
  unsigned_long uVar1;
  bool bVar2;
  Parameters *this_00;
  Group *this_01;
  Parameter *this_02;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar3;
  vector<double,_std::allocator<double>_> *pvVar4;
  double *pdVar5;
  runtime_error *this_03;
  long lVar6;
  size_t j;
  size_t col;
  ulong uVar7;
  size_t sVar8;
  allocator<char> local_69;
  ForcePlatform *local_68;
  string local_60;
  long local_40;
  double local_38;
  
  local_68 = this;
  this_00 = ezc3d::c3d::parameters(c3d);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"FORCE_PLATFORM",&local_69)
  ;
  this_01 = ParametersNS::Parameters::group(this_00,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  sVar8 = local_68->_type;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"CAL_MATRIX",&local_69);
  bVar2 = ParametersNS::GroupNS::Group::isParameter(this_01,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  if (bVar2) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"CAL_MATRIX",&local_69);
    this_02 = ParametersNS::GroupNS::Group::parameter(this_01,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    pvVar3 = ParametersNS::GroupNS::Parameter::dimension(this_02);
    if ((0x10 < (ulong)((long)(pvVar3->
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(pvVar3->
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                             _M_impl.super__Vector_impl_data._M_start)) &&
       (pvVar3 = ParametersNS::GroupNS::Parameter::dimension(this_02),
       idx < (pvVar3->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start[2])) {
      pvVar4 = ParametersNS::GroupNS::Parameter::valuesAsDouble(this_02);
      if ((pvVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_finish !=
          (pvVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_start) {
        uVar7 = (ulong)(sVar8 - 1 < 4) - 1 | 6;
        pvVar3 = ParametersNS::GroupNS::Parameter::dimension(this_02);
        uVar1 = *(pvVar3->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                 .super__Vector_impl_data._M_start;
        pvVar3 = ParametersNS::GroupNS::Parameter::dimension(this_02);
        local_68 = (ForcePlatform *)&local_68->_calMatrix;
        lVar6 = uVar1 * (pvVar3->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                        _M_impl.super__Vector_impl_data._M_start[1] * idx * 8;
        for (sVar8 = 0; sVar8 != uVar7; sVar8 = sVar8 + 1) {
          local_40 = lVar6;
          for (col = 0; uVar7 != col; col = col + 1) {
            local_38 = *(double *)
                        ((long)(pvVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl
                               .super__Vector_impl_data._M_start + lVar6);
            pdVar5 = Matrix::operator()((Matrix *)local_68,sVar8,col);
            *pdVar5 = local_38;
            lVar6 = lVar6 + uVar7 * 8;
          }
          lVar6 = local_40 + 8;
        }
        return;
      }
      Matrix::setIdentity(&(local_68->_calMatrix).super_Matrix);
      return;
    }
    if (2 < local_68->_type - 1) {
      this_03 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this_03,
                 "FORCE_PLATFORM:CAL_MATRIX is not fill properly to extract Force platform informations"
                );
LAB_0013332e:
      __cxa_throw(this_03,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else if (local_68->_type != 2) {
    this_03 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_03,
               "FORCE_PLATFORM:CAL_MATRIX was not found, but is required for the type of force platform"
              );
    goto LAB_0013332e;
  }
  return;
}

Assistant:

void ezc3d::Modules::ForcePlatform::extractCalMatrix(size_t idx,
                                                     const ezc3d::c3d &c3d) {
  const ezc3d::ParametersNS::GroupNS::Group &groupPF(
      c3d.parameters().group("FORCE_PLATFORM"));

  size_t nChannels(-1);
  if (_type >= 1 && _type <= 4) {
    nChannels = 6;
  }

  if (!groupPF.isParameter("CAL_MATRIX")) {
    if (_type == 2) {
      // CAL_MATRIX is ignore for type 2
      // If none is found, returns all zeros
      return;
    } else {
      throw std::runtime_error(
          "FORCE_PLATFORM:CAL_MATRIX was not found, but is "
          "required for the type of force platform");
    }
  }

  // Check dimensions
  const auto &calMatrixParam(groupPF.parameter("CAL_MATRIX"));
  if (calMatrixParam.dimension().size() < 3 ||
      calMatrixParam.dimension()[2] <= idx) {
    if (_type == 1 || _type == 2 || _type == 3) {
      // CAL_MATRIX is ignore for type 2
      // If none is found, returns all zeros
      return;
    } else {
      throw std::runtime_error("FORCE_PLATFORM:CAL_MATRIX is not fill properly "
                               "to extract Force platform informations");
    }
  }

  const std::vector<double> &val(calMatrixParam.valuesAsDouble());
  if (val.size() == 0) {
    // This is for Motion Analysis not providing a calibration matrix
    _calMatrix.setIdentity();
  } else {
    size_t skip(calMatrixParam.dimension()[0] * calMatrixParam.dimension()[1]);
    for (size_t i = 0; i < nChannels; ++i) {
      for (size_t j = 0; j < nChannels; ++j) {
        _calMatrix(i, j) = val[skip * idx + j * nChannels + i];
      }
    }
  }
}